

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_GeometryFingerprint::Write(ON_GeometryFingerprint *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  ON_BinaryArchive *binary_archive_local;
  ON_GeometryFingerprint *this_local;
  
  bVar1 = ON_BinaryArchive::WriteInt(binary_archive,this->m_topologyCRC);
  if (bVar1) {
    bVar1 = ON_WeightedAverageHash::Write(&this->m_pointWAH,binary_archive);
    if (bVar1) {
      bVar1 = ON_WeightedAverageHash::Write(&this->m_edgeWAH,binary_archive);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_GeometryFingerprint::Write(ON_BinaryArchive& binary_archive) const
{
  if (!binary_archive.WriteInt(m_topologyCRC))
    return false;
  if (!m_pointWAH.Write(binary_archive))
    return false;
  if (!m_edgeWAH.Write(binary_archive))
    return false;
  return true;
}